

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::TestGenerator::Generate
          (TestGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string filename;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  TestGenerator *this_local;
  
  filename.field_2._8_8_ = error;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"Test.java",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"outer_class_scope",&local_89);
  TryInsert(this,(string *)local_50,&local_88,context);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"class_scope:foo.Bar",&local_b1);
  TryInsert(this,(string *)local_50,&local_b0,context);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"class_scope:foo.Bar.Baz",&local_d9);
  TryInsert(this,(string *)local_50,&local_d8,context);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"builder_scope:foo.Bar",&local_101);
  TryInsert(this,(string *)local_50,&local_100,context);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"builder_scope:foo.Bar.Baz",&local_129);
  TryInsert(this,(string *)local_50,&local_128,context);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"enum_scope:foo.Qux",&local_151);
  TryInsert(this,(string *)local_50,&local_150,context);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)local_50);
  return true;
}

Assistant:

bool Generate(const FileDescriptor* file, const std::string& parameter,
                GeneratorContext* context, std::string* error) const override {
    std::string filename = "Test.java";
    TryInsert(filename, "outer_class_scope", context);
    TryInsert(filename, "class_scope:foo.Bar", context);
    TryInsert(filename, "class_scope:foo.Bar.Baz", context);
    TryInsert(filename, "builder_scope:foo.Bar", context);
    TryInsert(filename, "builder_scope:foo.Bar.Baz", context);
    TryInsert(filename, "enum_scope:foo.Qux", context);
    return true;
  }